

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O0

void Minisat::sort<Minisat::Option*,Minisat::Option::OptionLt>(Option *param_1,int param_2)

{
  _func_int **pp_Var1;
  bool bVar2;
  int iVar3;
  int j;
  int i;
  Option *tmp;
  Option *pivot;
  Option *y;
  Option *in_stack_ffffffffffffffc8;
  int iVar4;
  
  if (param_2 < 0x10) {
    selectionSort<Minisat::Option*,Minisat::Option::OptionLt>(param_1,param_2);
  }
  else {
    iVar4 = -1;
    y = param_1;
    iVar3 = param_2;
    while( true ) {
      do {
        iVar4 = iVar4 + 1;
        bVar2 = Option::OptionLt::operator()
                          ((OptionLt *)CONCAT44(iVar4,iVar3),in_stack_ffffffffffffffc8,y);
      } while (bVar2);
      do {
        iVar3 = iVar3 + -1;
        bVar2 = Option::OptionLt::operator()
                          ((OptionLt *)CONCAT44(iVar4,iVar3),in_stack_ffffffffffffffc8,y);
      } while (bVar2);
      if (iVar3 <= iVar4) break;
      pp_Var1 = (&param_1->_vptr_Option)[iVar4];
      (&param_1->_vptr_Option)[iVar4] = (&param_1->_vptr_Option)[iVar3];
      (&param_1->_vptr_Option)[iVar3] = pp_Var1;
    }
    sort<Minisat::Option*,Minisat::Option::OptionLt>(param_1,iVar4);
    sort<Minisat::Option*,Minisat::Option::OptionLt>(&param_1->_vptr_Option + iVar4,param_2 - iVar4)
    ;
  }
  return;
}

Assistant:

void sort(T* array, int size, LessThan lt)
{
    if (size <= 15)
        selectionSort(array, size, lt);

    else{
        T           pivot = array[size / 2];
        T           tmp;
        int         i = -1;
        int         j = size;

        for(;;){
            do i++; while(lt(array[i], pivot));
            do j--; while(lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }

        sort(array    , i     , lt);
        sort(&array[i], size-i, lt);
    }
}